

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 auVar8 [16];
  Primitive *prim;
  byte bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [64];
  uint uVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  ulong *local_1300;
  Ray *local_12f8;
  RayQueryContext *local_12f0;
  Primitive *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1300 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx((undefined1  [16])aVar2,auVar22);
      auVar26._8_4_ = 0x219392ef;
      auVar26._0_8_ = 0x219392ef219392ef;
      auVar26._12_4_ = 0x219392ef;
      auVar22 = vcmpps_avx(auVar22,auVar26,1);
      auVar22 = vblendvps_avx((undefined1  [16])aVar2,auVar26,auVar22);
      auVar26 = vrcpps_avx(auVar22);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar22 = vfnmadd231ps_fma(auVar27,auVar26,auVar22);
      auVar8 = vfmadd132ps_fma(auVar22,auVar26,auVar26);
      fVar25 = auVar8._0_4_;
      local_1238._4_4_ = fVar25;
      local_1238._0_4_ = fVar25;
      local_1238._8_4_ = fVar25;
      local_1238._12_4_ = fVar25;
      local_1238._16_4_ = fVar25;
      local_1238._20_4_ = fVar25;
      local_1238._24_4_ = fVar25;
      local_1238._28_4_ = fVar25;
      auVar22 = vmovshdup_avx(auVar8);
      uVar20 = auVar22._0_8_;
      local_1258._8_8_ = uVar20;
      local_1258._0_8_ = uVar20;
      local_1258._16_8_ = uVar20;
      local_1258._24_8_ = uVar20;
      auVar27 = vshufpd_avx(auVar8,auVar8,1);
      auVar26 = vshufps_avx(auVar8,auVar8,0xaa);
      uVar20 = auVar26._0_8_;
      local_1278._8_8_ = uVar20;
      local_1278._0_8_ = uVar20;
      local_1278._16_8_ = uVar20;
      local_1278._24_8_ = uVar20;
      auVar28._0_4_ = fVar25 * (ray->org).field_0.m128[0];
      auVar28._4_4_ = auVar8._4_4_ * (ray->org).field_0.m128[1];
      auVar28._8_4_ = auVar8._8_4_ * (ray->org).field_0.m128[2];
      auVar28._12_4_ = auVar8._12_4_ * (ray->org).field_0.m128[3];
      auVar26 = vmovshdup_avx(auVar28);
      auVar8 = vshufps_avx(auVar28,auVar28,0xaa);
      uVar17 = (ulong)(fVar25 < 0.0) * 0x20;
      uVar18 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
      uVar13 = CONCAT44(auVar28._0_4_,auVar28._0_4_);
      local_1298._0_8_ = uVar13 ^ 0x8000000080000000;
      local_1298._8_4_ = -auVar28._0_4_;
      local_1298._12_4_ = -auVar28._0_4_;
      local_1298._16_4_ = -auVar28._0_4_;
      local_1298._20_4_ = -auVar28._0_4_;
      local_1298._24_4_ = -auVar28._0_4_;
      local_1298._28_4_ = -auVar28._0_4_;
      auVar30 = ZEXT3264(local_1298);
      auVar21 = ZEXT3264(local_1238);
      uVar14 = auVar26._0_4_;
      uVar24 = auVar26._4_4_;
      local_12b8._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = uVar14 ^ 0x80000000;
      local_12b8._12_4_ = uVar24 ^ 0x80000000;
      local_12b8._16_4_ = uVar14 ^ 0x80000000;
      local_12b8._20_4_ = uVar24 ^ 0x80000000;
      local_12b8._24_4_ = uVar14 ^ 0x80000000;
      local_12b8._28_4_ = uVar24 ^ 0x80000000;
      auVar31 = ZEXT3264(local_12b8);
      auVar23 = ZEXT3264(local_1258);
      uVar14 = auVar8._0_4_;
      uVar24 = auVar8._4_4_;
      local_12d8._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = uVar14 ^ 0x80000000;
      local_12d8._12_4_ = uVar24 ^ 0x80000000;
      local_12d8._16_4_ = uVar14 ^ 0x80000000;
      local_12d8._20_4_ = uVar24 ^ 0x80000000;
      local_12d8._24_4_ = uVar14 ^ 0x80000000;
      local_12d8._28_4_ = uVar24 ^ 0x80000000;
      auVar32 = ZEXT3264(local_12d8);
      auVar29 = ZEXT3264(local_1278);
      uVar19 = auVar3._0_4_;
      local_11f8._4_4_ = uVar19;
      local_11f8._0_4_ = uVar19;
      local_11f8._8_4_ = uVar19;
      local_11f8._12_4_ = uVar19;
      local_11f8._16_4_ = uVar19;
      local_11f8._20_4_ = uVar19;
      local_11f8._24_4_ = uVar19;
      local_11f8._28_4_ = uVar19;
      auVar33 = ZEXT3264(local_11f8);
      local_1218._4_4_ = fVar1;
      local_1218._0_4_ = fVar1;
      local_1218._8_4_ = fVar1;
      local_1218._12_4_ = fVar1;
      local_1218._16_4_ = fVar1;
      local_1218._20_4_ = fVar1;
      local_1218._24_4_ = fVar1;
      local_1218._28_4_ = fVar1;
      auVar34 = ZEXT3264(local_1218);
      local_12f8 = ray;
      local_12f0 = context;
LAB_01535a3f:
      if (local_1300 != local_11d8) {
        uVar13 = local_1300[-1];
        local_1300 = local_1300 + -1;
        while ((uVar13 & 8) == 0) {
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar17),auVar30._0_32_,
                                    auVar21._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar18),auVar31._0_32_,
                                   auVar23._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar3));
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar16),auVar32._0_32_,
                                    auVar29._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar22),auVar33._0_32_);
          auVar4 = vpmaxsd_avx2(auVar4,auVar5);
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + (uVar17 ^ 0x20)),
                                    auVar30._0_32_,auVar21._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + (uVar18 ^ 0x20)),
                                   auVar31._0_32_,auVar23._0_32_);
          auVar5 = vpminsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar3));
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + (uVar16 ^ 0x20)),
                                    auVar32._0_32_,auVar29._0_32_);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar22),auVar34._0_32_);
          auVar5 = vpminsd_avx2(auVar5,auVar6);
          auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
          iVar11 = vmovmskps_avx(auVar4);
          if (iVar11 == 0xff) goto LAB_01535a3f;
          bVar9 = ~(byte)iVar11;
          uVar12 = uVar13 & 0xfffffffffffffff0;
          lVar7 = 0;
          for (uVar13 = (ulong)bVar9; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
          {
            lVar7 = lVar7 + 1;
          }
          uVar13 = *(ulong *)(uVar12 + lVar7 * 8);
          uVar14 = bVar9 - 1 & (uint)bVar9;
          uVar15 = (ulong)uVar14;
          if (uVar14 != 0) {
            do {
              *local_1300 = uVar13;
              local_1300 = local_1300 + 1;
              lVar7 = 0;
              for (uVar13 = uVar15; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar7 = lVar7 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              uVar13 = *(ulong *)(uVar12 + lVar7 * 8);
            } while (uVar15 != 0);
          }
        }
        local_12e8 = (Primitive *)(uVar13 & 0xfffffffffffffff0);
        local_12e0 = (ulong)((uint)uVar13 & 0xf) - 7;
        while( true ) {
          local_12e0 = local_12e0 + -1;
          if (local_12e0 == 0) break;
          prim = local_12e8;
          local_12e8 = local_12e8 + 1;
          bVar10 = InstanceArrayIntersector1::occluded(&local_1301,ray,local_12f0,prim);
          auVar34 = ZEXT3264(local_1218);
          auVar33 = ZEXT3264(local_11f8);
          ray = local_12f8;
          if (bVar10) {
            local_12f8->tfar = -INFINITY;
            return;
          }
        }
        auVar21 = ZEXT3264(local_1238);
        auVar23 = ZEXT3264(local_1258);
        auVar29 = ZEXT3264(local_1278);
        auVar30 = ZEXT3264(local_1298);
        auVar31 = ZEXT3264(local_12b8);
        auVar32 = ZEXT3264(local_12d8);
        goto LAB_01535a3f;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }